

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraceID.h
# Opt level: O1

void __thiscall
jaegertracing::TraceID::print<std::ostream>
          (TraceID *this,basic_ostream<char,_std::char_traits<char>_> *out)

{
  ostream *poVar1;
  uint64_t uVar2;
  long lVar3;
  ostream oVar4;
  
  uVar2 = this->_high;
  lVar3 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar3 + -0x18) + 0x10) = 0x10;
  lVar3 = *(long *)(lVar3 + -0x18);
  poVar1 = out + lVar3;
  oVar4 = out[lVar3 + 0xe1];
  if (uVar2 != 0) {
    if (oVar4 == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar1);
      poVar1[0xe0] = oVar4;
      poVar1[0xe1] = (ostream)0x1;
    }
    poVar1[0xe0] = (ostream)0x30;
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    out = std::ostream::_M_insert<unsigned_long>((ulong)out);
    lVar3 = *(long *)out;
    *(undefined8 *)(out + *(long *)(lVar3 + -0x18) + 0x10) = 0x10;
    lVar3 = *(long *)(lVar3 + -0x18);
    poVar1 = out + lVar3;
    oVar4 = out[lVar3 + 0xe1];
  }
  if (oVar4 == (ostream)0x0) {
    oVar4 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ostream)0x1;
  }
  poVar1[0xe0] = (ostream)0x30;
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)out);
  return;
}

Assistant:

void print(Stream& out) const
    {
        if (_high == 0) {
            out << std::setw(16) << std::setfill('0') << std::hex << _low;
        }
        else {
            out << std::setw(16) << std::setfill('0') << std::hex << _high
                << std::setw(16) << std::setfill('0') << std::hex << _low;
        }
    }